

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_test.cc
# Opt level: O0

void basic_test(void)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  int8_t delta_8;
  uint8_t val_8_new;
  uint8_t val_8;
  atomic<unsigned_char> counter_8;
  int16_t delta_16;
  uint16_t val_16_new;
  uint16_t val_16;
  atomic<unsigned_short> counter_16;
  int32_t delta_32;
  uint32_t val_32_new;
  uint32_t val_32;
  atomic<unsigned_int> counter_32;
  int64_t delta_64;
  uint64_t val_64_new;
  uint64_t val_64;
  atomic<unsigned_long> counter_64;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  memory_order in_stack_ffffffffffffff68;
  uint16_t in_stack_ffffffffffffff6c;
  uint8_t in_stack_ffffffffffffff6e;
  uint8_t in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff77;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  atomic_init_uint64_t
            ((atomic<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))));
  atomic_store_uint64_t
            ((atomic<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))),
             memory_order_relaxed);
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar4 != 100) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x25);
    basic_test::__test_pass = 0;
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar4 != 100) {
      __assert_fail("atomic_get_uint64_t(&counter_64) == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x25,"void basic_test()");
    }
  }
  atomic_cas_uint64_t((atomic<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT17(in_stack_ffffffffffffff6f,
                               CONCAT16(in_stack_ffffffffffffff6e,
                                        CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ))),0x1012b8);
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar4 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x27);
    basic_test::__test_pass = 0;
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar4 != 200) {
      __assert_fail("atomic_get_uint64_t(&counter_64) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x27,"void basic_test()");
    }
  }
  atomic_incr_uint64_t
            ((atomic<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar4 != 0xc9) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x29);
    basic_test::__test_pass = 0;
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar4 != 0xc9) {
      __assert_fail("atomic_get_uint64_t(&counter_64) == 201",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x29,"void basic_test()");
    }
  }
  atomic_decr_uint64_t
            ((atomic<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar4 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x2b);
    basic_test::__test_pass = 0;
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar4 != 200) {
      __assert_fail("atomic_get_uint64_t(&counter_64) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x2b,"void basic_test()");
    }
  }
  atomic_add_uint64_t((atomic<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT17(in_stack_ffffffffffffff6f,
                               CONCAT16(in_stack_ffffffffffffff6e,
                                        CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ))),memory_order_relaxed);
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar4 != 0xd2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x2d);
    basic_test::__test_pass = 0;
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar4 != 0xd2) {
      __assert_fail("atomic_get_uint64_t(&counter_64) == 210",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x2d,"void basic_test()");
    }
  }
  atomic_sub_uint64_t((atomic<unsigned_long> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT17(in_stack_ffffffffffffff6f,
                               CONCAT16(in_stack_ffffffffffffff6e,
                                        CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ))),memory_order_relaxed);
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar4 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x2f);
    basic_test::__test_pass = 0;
    uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar4 != 200) {
      __assert_fail("atomic_get_uint64_t(&counter_64) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x2f,"void basic_test()");
    }
  }
  atomic_init_uint32_t
            ((atomic<unsigned_int> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  atomic_store_uint32_t
            ((atomic<unsigned_int> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)),
             in_stack_ffffffffffffff68);
  uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar3 != 100) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x37);
    basic_test::__test_pass = 0;
    uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar3 != 100) {
      __assert_fail("atomic_get_uint32_t(&counter_32) == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x37,"void basic_test()");
    }
  }
  atomic_cas_uint32_t((atomic<unsigned_int> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT13(in_stack_ffffffffffffff6f,
                               CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)),
                      in_stack_ffffffffffffff68);
  uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar3 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x39);
    basic_test::__test_pass = 0;
    uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar3 != 200) {
      __assert_fail("atomic_get_uint32_t(&counter_32) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x39,"void basic_test()");
    }
  }
  atomic_incr_uint32_t
            ((atomic<unsigned_int> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar3 != 0xc9) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x3b);
    basic_test::__test_pass = 0;
    uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar3 != 0xc9) {
      __assert_fail("atomic_get_uint32_t(&counter_32) == 201",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x3b,"void basic_test()");
    }
  }
  atomic_decr_uint32_t
            ((atomic<unsigned_int> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar3 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x3d);
    basic_test::__test_pass = 0;
    uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar3 != 200) {
      __assert_fail("atomic_get_uint32_t(&counter_32) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x3d,"void basic_test()");
    }
  }
  atomic_add_uint32_t((atomic<unsigned_int> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT13(in_stack_ffffffffffffff6f,
                               CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)),
                      in_stack_ffffffffffffff68);
  uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar3 != 0xd2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x3f);
    basic_test::__test_pass = 0;
    uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar3 != 0xd2) {
      __assert_fail("atomic_get_uint32_t(&counter_32) == 210",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x3f,"void basic_test()");
    }
  }
  atomic_sub_uint32_t((atomic<unsigned_int> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT13(in_stack_ffffffffffffff6f,
                               CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)),
                      in_stack_ffffffffffffff68);
  uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar3 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x41);
    basic_test::__test_pass = 0;
    uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar3 != 200) {
      __assert_fail("atomic_get_uint32_t(&counter_32) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x41,"void basic_test()");
    }
  }
  atomic_init_uint16_t
            ((atomic<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT11(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e));
  atomic_store_uint16_t
            ((atomic<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT11(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e),in_stack_ffffffffffffff68
            );
  uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar2 != 100) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x49);
    basic_test::__test_pass = 0;
    uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar2 != 100) {
      __assert_fail("atomic_get_uint16_t(&counter_16) == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x49,"void basic_test()");
    }
  }
  atomic_cas_uint16_t((atomic<unsigned_short> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT11(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e),
                      in_stack_ffffffffffffff6c);
  uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar2 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x4b);
    basic_test::__test_pass = 0;
    uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar2 != 200) {
      __assert_fail("atomic_get_uint16_t(&counter_16) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x4b,"void basic_test()");
    }
  }
  atomic_incr_uint16_t
            ((atomic<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar2 != 0xc9) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x4d);
    basic_test::__test_pass = 0;
    uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar2 != 0xc9) {
      __assert_fail("atomic_get_uint16_t(&counter_16) == 201",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x4d,"void basic_test()");
    }
  }
  atomic_decr_uint16_t
            ((atomic<unsigned_short> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                )))),
             CONCAT13(in_stack_ffffffffffffff6f,
                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar2 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x4f);
    basic_test::__test_pass = 0;
    uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar2 != 200) {
      __assert_fail("atomic_get_uint16_t(&counter_16) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x4f,"void basic_test()");
    }
  }
  atomic_add_uint16_t((atomic<unsigned_short> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT11(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e),
                      in_stack_ffffffffffffff68);
  uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar2 != 0xd2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x51);
    basic_test::__test_pass = 0;
    uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar2 != 0xd2) {
      __assert_fail("atomic_get_uint16_t(&counter_16) == 210",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x51,"void basic_test()");
    }
  }
  atomic_sub_uint16_t((atomic<unsigned_short> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(in_stack_ffffffffffffff76,
                                        CONCAT15(in_stack_ffffffffffffff75,
                                                 CONCAT14(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70)))),
                      CONCAT11(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e),
                      in_stack_ffffffffffffff68);
  uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,
                                                CONCAT15(in_stack_ffffffffffffff75,
                                                         CONCAT14(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70)))),
                              CONCAT13(in_stack_ffffffffffffff6f,
                                       CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
                                      ));
  if (uVar2 != 200) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x53);
    basic_test::__test_pass = 0;
    uVar2 = atomic_get_uint16_t((atomic<unsigned_short> *)
                                CONCAT17(in_stack_ffffffffffffff77,
                                         CONCAT16(in_stack_ffffffffffffff76,
                                                  CONCAT15(in_stack_ffffffffffffff75,
                                                           CONCAT14(in_stack_ffffffffffffff74,
                                                                    in_stack_ffffffffffffff70)))),
                                CONCAT13(in_stack_ffffffffffffff6f,
                                         CONCAT12(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff6c)));
    if (uVar2 != 200) {
      __assert_fail("atomic_get_uint16_t(&counter_16) == 200",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x53,"void basic_test()");
    }
  }
  uVar6 = 100;
  uVar5 = 10;
  atomic_init_uint8_t((atomic<unsigned_char> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               (uint7)CONCAT15(100,CONCAT14(10,in_stack_ffffffffffffff70))),
                      in_stack_ffffffffffffff6f);
  uVar7 = 0x32;
  atomic_store_uint8_t
            ((atomic<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(0x32,CONCAT15(uVar6,CONCAT14(uVar5,in_stack_ffffffffffffff70)))),
             in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68);
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                             CONCAT13(in_stack_ffffffffffffff6f,
                                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c))
                            );
  if (uVar1 != '2') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x5b);
    basic_test::__test_pass = 0;
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                               CONCAT13(in_stack_ffffffffffffff6f,
                                        CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c
                                                )));
    if (uVar1 != '2') {
      __assert_fail("atomic_get_uint8_t(&counter_8) == 50",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x5b,"void basic_test()");
    }
  }
  atomic_cas_uint8_t((atomic<unsigned_char> *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,in_stack_ffffffffffffff70
                                                                    )))),in_stack_ffffffffffffff6f,
                     in_stack_ffffffffffffff6e);
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                             CONCAT13(in_stack_ffffffffffffff6f,
                                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c))
                            );
  if (uVar1 != 'd') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x5d);
    basic_test::__test_pass = 0;
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                               CONCAT13(in_stack_ffffffffffffff6f,
                                        CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c
                                                )));
    if (uVar1 != 'd') {
      __assert_fail("atomic_get_uint8_t(&counter_8) == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x5d,"void basic_test()");
    }
  }
  atomic_incr_uint8_t((atomic<unsigned_char> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                      CONCAT13(in_stack_ffffffffffffff6f,
                               CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                             CONCAT13(in_stack_ffffffffffffff6f,
                                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c))
                            );
  if (uVar1 != 'e') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x5f);
    basic_test::__test_pass = 0;
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                               CONCAT13(in_stack_ffffffffffffff6f,
                                        CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c
                                                )));
    if (uVar1 != 'e') {
      __assert_fail("atomic_get_uint8_t(&counter_8) == 101",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x5f,"void basic_test()");
    }
  }
  atomic_decr_uint8_t((atomic<unsigned_char> *)
                      CONCAT17(in_stack_ffffffffffffff77,
                               CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                      CONCAT13(in_stack_ffffffffffffff6f,
                               CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)));
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                             CONCAT13(in_stack_ffffffffffffff6f,
                                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c))
                            );
  if (uVar1 != 'd') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x61);
    basic_test::__test_pass = 0;
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                               CONCAT13(in_stack_ffffffffffffff6f,
                                        CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c
                                                )));
    if (uVar1 != 'd') {
      __assert_fail("atomic_get_uint8_t(&counter_8) == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x61,"void basic_test()");
    }
  }
  atomic_add_uint8_t((atomic<unsigned_char> *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,in_stack_ffffffffffffff70
                                                                    )))),in_stack_ffffffffffffff6f,
                     in_stack_ffffffffffffff68);
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                             CONCAT13(in_stack_ffffffffffffff6f,
                                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c))
                            );
  if (uVar1 != 'n') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,99);
    basic_test::__test_pass = 0;
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                               CONCAT13(in_stack_ffffffffffffff6f,
                                        CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c
                                                )));
    if (uVar1 != 'n') {
      __assert_fail("atomic_get_uint8_t(&counter_8) == 110",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,99,"void basic_test()");
    }
  }
  atomic_sub_uint8_t((atomic<unsigned_char> *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,in_stack_ffffffffffffff70
                                                                    )))),in_stack_ffffffffffffff6f,
                     in_stack_ffffffffffffff68);
  uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                             CONCAT17(in_stack_ffffffffffffff77,
                                      CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                             CONCAT13(in_stack_ffffffffffffff6f,
                                      CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c))
                            );
  if (uVar1 != 'd') {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
            ,0x65);
    basic_test::__test_pass = 0;
    uVar1 = atomic_get_uint8_t((atomic<unsigned_char> *)
                               CONCAT17(in_stack_ffffffffffffff77,
                                        CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,
                                                  in_stack_ffffffffffffff70)))),
                               CONCAT13(in_stack_ffffffffffffff6f,
                                        CONCAT12(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c
                                                )));
    if (uVar1 != 'd') {
      __assert_fail("atomic_get_uint8_t(&counter_8) == 100",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/atomic_test.cc"
                    ,0x65,"void basic_test()");
    }
  }
  if (basic_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","basic test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","basic test");
  }
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    atomic_uint64_t counter_64;
    uint64_t val_64 = 0, val_64_new = 200;
    int64_t delta_64 = 10;
    atomic_init_uint64_t(&counter_64, val_64);
    val_64 = 100;
    atomic_store_uint64_t(&counter_64, val_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 100);
    atomic_cas_uint64_t(&counter_64, val_64, val_64_new);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);
    atomic_incr_uint64_t(&counter_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 201);
    atomic_decr_uint64_t(&counter_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);
    atomic_add_uint64_t(&counter_64, delta_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 210);
    atomic_sub_uint64_t(&counter_64, delta_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);

    atomic_uint32_t counter_32;
    uint32_t val_32 = 0, val_32_new = 200;
    int32_t delta_32 = 10;
    atomic_init_uint32_t(&counter_32, val_32);
    val_32 = 100;
    atomic_store_uint32_t(&counter_32, val_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 100);
    atomic_cas_uint32_t(&counter_32, val_32, val_32_new);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);
    atomic_incr_uint32_t(&counter_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 201);
    atomic_decr_uint32_t(&counter_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);
    atomic_add_uint32_t(&counter_32, delta_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 210);
    atomic_sub_uint32_t(&counter_32, delta_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);

    atomic_uint16_t counter_16;
    uint16_t val_16 = 0, val_16_new = 200;
    int16_t delta_16 = 10;
    atomic_init_uint16_t(&counter_16, val_16);
    val_16 = 100;
    atomic_store_uint16_t(&counter_16, val_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 100);
    atomic_cas_uint16_t(&counter_16, val_16, val_16_new);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);
    atomic_incr_uint16_t(&counter_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 201);
    atomic_decr_uint16_t(&counter_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);
    atomic_add_uint16_t(&counter_16, delta_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 210);
    atomic_sub_uint16_t(&counter_16, delta_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);

    atomic_uint8_t counter_8;
    uint8_t val_8 = 0, val_8_new = 100;
    int8_t delta_8 = 10;
    atomic_init_uint8_t(&counter_8, val_8);
    val_8 = 50;
    atomic_store_uint8_t(&counter_8, val_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 50);
    atomic_cas_uint8_t(&counter_8, val_8, val_8_new);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);
    atomic_incr_uint8_t(&counter_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 101);
    atomic_decr_uint8_t(&counter_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);
    atomic_add_uint8_t(&counter_8, delta_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 110);
    atomic_sub_uint8_t(&counter_8, delta_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);

    TEST_RESULT("basic test");
}